

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

int __thiscall
gl4cts::UncommittedRegionsAccessTestCase::init
          (UncommittedRegionsAccessTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *extraout_RAX;
  int *piVar1;
  iterator iVar2;
  int local_18 [2];
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_18[1] = 0x9100;
  iVar2._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar1 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
           mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,local_18 + 1);
    iVar2._M_current =
         (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
         mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar1 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = 0x9100;
    iVar2._M_current = iVar2._M_current + 1;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  local_18[0] = 0x9102;
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,local_18);
    piVar1 = extraout_RAX;
  }
  else {
    *iVar2._M_current = 0x9102;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return (int)piVar1;
}

Assistant:

void UncommittedRegionsAccessTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}